

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

string * __thiscall
iutest::detail::ElementsAreMatcherBase::
WhichIs<0,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>>
          (string *__return_storage_ptr__,ElementsAreMatcherBase *this,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
          *matchers)

{
  type **in_RCX;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"ElementsAre: {",(allocator<char> *)&local_30);
  WhichIs_<std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::NeMatcher<int>,iutest::detail::EqMatcher<int>>,0,3>
            (&local_30,this,
             (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::NeMatcher<int>,_iutest::detail::EqMatcher<int>_>
              *)&iutest_type_traits::enabler_t<void>::value,in_RCX);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string WhichIs(const T& matchers)
    {
        ::std::string str = "ElementsAre: {";
        str += WhichIs_<T, N, tuples::tuple_size<T>::value-1>(matchers);
        str += "}";
        return str;
    }